

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readfile.h
# Opt level: O0

char * readfile(char *filename,size_t max_size,size_t *size_out)

{
  size_t local_70;
  FILE *local_68;
  char *local_60;
  char *buf;
  size_t _out;
  size_t n;
  size_t pos;
  size_t size;
  long k;
  FILE *fp;
  size_t *size_out_local;
  size_t max_size_local;
  char *filename_local;
  
  local_68 = (FILE *)size_out;
  if (size_out == (size_t *)0x0) {
    local_68 = (FILE *)&buf;
  }
  fp = local_68;
  size_out_local = (size_t *)max_size;
  max_size_local = (size_t)filename;
  k = (long)fopen(filename,"rb");
  pos = 0;
  local_60 = (char *)0x0;
  if ((FILE *)k != (FILE *)0x0) {
    fseek((FILE *)k,0,2);
    size = ftell((FILE *)k);
    if ((-1 < (long)size) &&
       ((pos = size, *(size_t *)fp = size, size_out_local == (size_t *)0x0 ||
        (pos <= size_out_local)))) {
      rewind((FILE *)k);
      if (pos == 0) {
        local_70 = 1;
      }
      else {
        local_70 = pos;
      }
      local_60 = (char *)malloc(local_70);
      if (local_60 != (char *)0x0) {
        n = 0;
        while (_out = fread(local_60 + n,1,pos - n,(FILE *)k), _out != 0) {
          n = _out + n;
        }
        if (n == pos) {
          fclose((FILE *)k);
          *(size_t *)fp = pos;
          return local_60;
        }
        _out = 0;
      }
    }
  }
  if (k != 0) {
    fclose((FILE *)k);
  }
  if (local_60 != (char *)0x0) {
    free(local_60);
  }
  *(size_t *)fp = pos;
  return (char *)0x0;
}

Assistant:

static char *readfile(const char *filename, size_t max_size, size_t *size_out)
{
    FILE *fp;
    long k;
    size_t size, pos, n, _out;
    char *buf;

    size_out = size_out ? size_out : &_out;

    fp = fopen(filename, "rb");
    size = 0;
    buf = 0;

    if (!fp) {
        goto fail;
    }
    fseek(fp, 0L, SEEK_END);
    k = ftell(fp);
    if (k < 0) goto fail;
    size = (size_t)k;
    *size_out = size;
    if (max_size > 0 && size > max_size) {
        goto fail;
    }
    rewind(fp);
    buf = (char *)malloc(size ? size : 1);
    if (!buf) {
        goto fail;
    }
    pos = 0;
    while ((n = fread(buf + pos, 1, size - pos, fp))) {
        pos += n;
    }
    if (pos != size) {
        goto fail;
    }
    fclose(fp);
    *size_out = size;
    return buf;

fail:
    if (fp) {
        fclose(fp);
    }
    if (buf) {
        free(buf);
    }
    *size_out = size;
    return 0;
}